

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UBool __thiscall
icu_63::ReorderingBuffer::equals(ReorderingBuffer *this,uint8_t *otherStart,uint8_t *otherLimit)

{
  byte bVar1;
  UChar UVar2;
  UChar *pUVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  
  pUVar3 = this->start;
  iVar6 = (int)otherLimit - (int)otherStart;
  iVar8 = (int)((ulong)((long)this->limit - (long)pUVar3) >> 1);
  if ((iVar8 <= iVar6) && (iVar6 / 3 <= iVar8)) {
    iVar5 = 0;
    iVar9 = 0;
    do {
      if (iVar8 <= iVar5) {
        return iVar6 <= iVar9;
      }
      if (iVar6 <= iVar9) {
        return '\0';
      }
      UVar2 = pUVar3[iVar5];
      uVar11 = (uint)(ushort)UVar2;
      iVar4 = iVar5 + 1;
      if ((UVar2 & 0xfc00U) == 0xd800) {
        uVar11 = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)pUVar3[iVar5 + 1] + 0xfca02400;
        iVar4 = iVar5 + 2;
      }
      iVar5 = iVar4;
      lVar7 = (long)iVar9;
      uVar13 = lVar7 + 1;
      bVar1 = otherStart[lVar7];
      uVar12 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        if (bVar1 < 0xe0) {
          uVar10 = iVar9 + 2;
          uVar12 = (bVar1 & 0x1f) << 6 | otherStart[uVar13] & 0x3f;
        }
        else if (bVar1 < 0xf0) {
          uVar12 = (bVar1 & 0xf) << 0xc | (otherStart[uVar13] & 0x3f) << 6 |
                   otherStart[lVar7 + 2] & 0x3f;
          uVar10 = iVar9 + 3;
        }
        else {
          uVar12 = otherStart[lVar7 + 3] & 0x3f |
                   (otherStart[lVar7 + 2] & 0x3f) << 6 |
                   (otherStart[uVar13] & 0x3f) << 0xc | (bVar1 & 7) << 0x12;
          uVar10 = iVar9 + 4;
        }
        uVar13 = (ulong)uVar10;
      }
      iVar9 = (int)uVar13;
    } while (uVar11 == uVar12);
  }
  return '\0';
}

Assistant:

UBool ReorderingBuffer::equals(const uint8_t *otherStart, const uint8_t *otherLimit) const {
    U_ASSERT((otherLimit - otherStart) <= INT32_MAX);  // ensured by caller
    int32_t length = (int32_t)(limit - start);
    int32_t otherLength = (int32_t)(otherLimit - otherStart);
    // For equal strings, UTF-8 is at least as long as UTF-16, and at most three times as long.
    if (otherLength < length || (otherLength / 3) > length) {
        return FALSE;
    }
    // Compare valid strings from between normalization boundaries.
    // (Invalid sequences are normalization-inert.)
    for (int32_t i = 0, j = 0;;) {
        if (i >= length) {
            return j >= otherLength;
        } else if (j >= otherLength) {
            return FALSE;
        }
        // Not at the end of either string yet.
        UChar32 c, other;
        U16_NEXT_UNSAFE(start, i, c);
        U8_NEXT_UNSAFE(otherStart, j, other);
        if (c != other) {
            return FALSE;
        }
    }
}